

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squserdata.h
# Opt level: O2

void __thiscall SQUserData::~SQUserData(SQUserData *this)

{
  SQWeakRef *pSVar1;
  
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQUserData_001441e0;
  if (((this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef & 0x80000000) == 0) {
    SQCollectable::RemoveFromChain
              (&((this->super_SQDelegable).super_SQCollectable._sharedstate)->_gc_chain,
               (SQCollectable_conflict *)this);
  }
  SQDelegable::SetDelegate(&this->super_SQDelegable,(SQTable *)0x0);
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQRefCounted_00144030;
  pSVar1 = (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._weakref;
  if (pSVar1 != (SQWeakRef *)0x0) {
    (pSVar1->_obj)._type = OT_NULL;
    (pSVar1->_obj)._unVal.pTable = (SQTable *)0x0;
  }
  return;
}

Assistant:

~SQUserData()
    {
        REMOVE_FROM_CHAIN(&_ss(this)->_gc_chain, this);
        SetDelegate(NULL);
    }